

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# workspace.c
# Opt level: O3

void workspace_list_destroy(workspace_list *workspace_list)

{
  ulong uVar1;
  ulong uVar2;
  
  if (workspace_list->theme != (theme *)0x0) {
    theme_destroy(workspace_list->theme);
  }
  map_destroy(workspace_list->client_map);
  uVar1 = workspace_list->count;
  if (uVar1 != 0) {
    uVar2 = 0;
    do {
      if (workspace_list->workspaces[uVar2] != (workspace *)0x0) {
        workspace_destroy(workspace_list->workspaces[uVar2]);
        uVar1 = workspace_list->count;
      }
      uVar2 = uVar2 + 1;
    } while (uVar2 < uVar1);
  }
  free(workspace_list->workspaces);
  free(workspace_list);
  return;
}

Assistant:

void workspace_list_destroy(struct workspace_list *workspace_list)
{
        if (workspace_list->theme != NULL) {
                theme_destroy(workspace_list->theme);
        }

        map_destroy(workspace_list->client_map);

        for (size_t i = 0; i < workspace_list->count; ++i) {
                if (workspace_list->workspaces[i] != NULL) {
                        workspace_destroy(workspace_list->workspaces[i]);
                }
        }

        free(workspace_list->workspaces);
        free(workspace_list);
}